

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ElemExpr *out_elem_expr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  Var *pVVar5;
  Location loc;
  Var var;
  Var local_118;
  undefined1 local_c8 [12];
  undefined4 uStack_bc;
  anon_union_16_2_ecfd7102_for_Location_1 local_b8 [4];
  Var local_78;
  
  GetToken((Token *)local_c8,this);
  bVar1 = MatchLpar(this,Item);
  bVar2 = Match(this,Lpar);
  bVar3 = Match(this,RefNull);
  if (bVar3) {
    if (((this->options_->features).bulk_memory_enabled_ == false) &&
       ((this->options_->features).reference_types_enabled_ == false)) {
      Error(this,0x19a879);
    }
    pVVar5 = (Var *)(local_c8 + 8);
    local_c8._0_8_ = (ulong)(uint)local_c8._4_4_ << 0x20;
    local_118.loc.field_1.field_0.line = 0;
    local_118.loc.field_1._4_8_ = 0;
    local_118.loc.filename.data_ = (char *)0x0;
    local_118.loc.filename.size_._0_4_ = 0;
    local_118.loc.filename.size_._4_4_ = 0;
    Var::Var(pVVar5,0xffffffff,&local_118.loc);
    out_elem_expr->kind = local_c8._0_4_;
    Var::operator=(&out_elem_expr->var,pVVar5);
  }
  else {
    bVar3 = Match(this,RefFunc);
    if (!bVar3) {
      return false;
    }
    local_b8[0].field_0.line = 0;
    local_b8[0].field_0.first_column = 0;
    local_b8[0].field_0.last_column = 0;
    local_c8._0_8_ = (char *)0x0;
    local_c8._8_4_ = 0;
    uStack_bc = 0;
    Var::Var(&local_118,0xffffffff,(Location *)local_c8);
    RVar4 = ParseVar(this,&local_118);
    if (RVar4.enum_ == Error) {
      Var::~Var(&local_118);
      return true;
    }
    Var::Var(&local_78,&local_118);
    pVVar5 = (Var *)(local_c8 + 8);
    local_c8._0_4_ = 1;
    Var::Var(pVVar5,&local_78);
    out_elem_expr->kind = local_c8._0_4_;
    Var::operator=(&out_elem_expr->var,pVVar5);
    Var::~Var(pVVar5);
    Var::~Var(&local_78);
    pVVar5 = &local_118;
  }
  Var::~Var(pVVar5);
  if (bVar2) {
    RVar4 = Expect(this,Rpar);
    if (!bVar1 || RVar4.enum_ == Error) {
      return true;
    }
  }
  else if (!bVar1) {
    return true;
  }
  Expect(this,Rpar);
  return true;
}

Assistant:

bool WastParser::ParseElemExprOpt(ElemExpr* out_elem_expr) {
  Location loc = GetLocation();
  bool item = MatchLpar(TokenType::Item);
  bool lpar = Match(TokenType::Lpar);
  if (Match(TokenType::RefNull)) {
    if (!(options_->features.bulk_memory_enabled() ||
          options_->features.reference_types_enabled())) {
      Error(loc, "ref.null not allowed");
    }
    *out_elem_expr = ElemExpr();
  } else if (Match(TokenType::RefFunc)) {
    Var var;
    CHECK_RESULT(ParseVar(&var));
    *out_elem_expr = ElemExpr(var);
  } else {
    return false;
  }
  if (lpar) {
    EXPECT(Rpar);
  }
  if (item) {
    EXPECT(Rpar);
  }
  return true;
}